

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guardedTests.cpp
# Opt level: O0

void __thiscall
cow_guarded_cow_guarded_1_Test::cow_guarded_cow_guarded_1_Test(cow_guarded_cow_guarded_1_Test *this)

{
  cow_guarded_cow_guarded_1_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__cow_guarded_cow_guarded_1_Test_00207570;
  return;
}

Assistant:

TEST(cow_guarded, cow_guarded_1)
{
    cow_guarded<int, std::timed_mutex> data(0);

    {
        auto data_handle = data.lock();

        ++(*data_handle);
    }

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle != nullptr);
        EXPECT_EQ(*data_handle, 1);

        std::thread th1([&data]() {
            auto data_handle2 = data.try_lock_shared();
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        std::thread th2([&data]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        std::thread th3([&data]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            EXPECT_TRUE(data_handle2 != nullptr);
            EXPECT_EQ(*data_handle2, 1);
        });

        th1.join();

        th2.join();
        th3.join();
    }

    {
        auto data_handle = data.lock();

        auto data_handle2 = data.lock_shared();

        ++(*data_handle);
        EXPECT_EQ(*data_handle, 2);

        EXPECT_TRUE(data_handle2 != nullptr);
        EXPECT_EQ(*data_handle2, 1);

        data_handle.cancel();
        EXPECT_TRUE(data_handle == nullptr);

        EXPECT_TRUE(data_handle2 != nullptr);
        EXPECT_EQ(*data_handle2, 1);
    }

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle != nullptr);
        EXPECT_EQ(*data_handle, 1);
    }
}